

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeCommit(sqlite3 *db,Vdbe *p)

{
  int iVar1;
  uint uVar2;
  Pager *pPager_00;
  char *pcVar3;
  Btree *pBVar4;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  Btree *pBt_5;
  Btree *pBt_4;
  char *zFile;
  Btree *pBt_3;
  int nMainFile;
  int retryCount;
  i64 offset;
  char *zMainFile;
  char *zSuper;
  sqlite3_vfs *pVfs;
  Btree *pBt_2;
  Btree *pBt_1;
  Pager *pPager;
  Btree *pBt;
  int needXcommit;
  int rc;
  int nTrans;
  int i;
  u32 iRandom;
  int res;
  sqlite3_file *pSuperJrnl;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  sqlite3 *in_stack_ffffffffffffff40;
  Btree *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  bool bVar5;
  undefined1 uVar6;
  Vdbe *in_stack_ffffffffffffff58;
  sqlite3 *in_stack_ffffffffffffff60;
  int local_84;
  int local_3c;
  int local_38;
  int local_34;
  int iVar7;
  sqlite3 *db_00;
  sqlite3 *psVar8;
  long lVar9;
  
  lVar9 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  bVar5 = false;
  local_3c = sqlite3VtabSync(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_34 = 0;
  while( true ) {
    uVar6 = false;
    if (local_3c == 0) {
      uVar6 = local_34 < in_RDI->nDb;
    }
    if ((bool)uVar6 == false) break;
    pBVar4 = in_RDI->aDb[local_34].pBt;
    iVar1 = sqlite3BtreeTxnState(pBVar4);
    if (iVar1 == 2) {
      bVar5 = true;
      sqlite3BtreeEnter((Btree *)0x170ac5);
      pPager_00 = sqlite3BtreePager(pBVar4);
      if (((in_RDI->aDb[local_34].safety_level != '\x01') &&
          (iVar1 = sqlite3PagerGetJournalMode(pPager_00), "\x01\x01"[iVar1] != '\0')) &&
         (iVar1 = sqlite3PagerIsMemdb(pPager_00), iVar1 == 0)) {
        local_38 = local_38 + 1;
      }
      local_3c = sqlite3PagerExclusiveLock((Pager *)in_stack_ffffffffffffff40);
      sqlite3BtreeLeave((Btree *)0x170b56);
    }
    local_34 = local_34 + 1;
  }
  if (local_3c == 0) {
    if ((bVar5) && (in_RDI->xCommitCallback != (_func_int_void_ptr *)0x0)) {
      iVar1 = (*in_RDI->xCommitCallback)(in_RDI->pCommitArg);
      if (iVar1 != 0) {
        local_3c = 0x213;
        goto LAB_00171319;
      }
      local_3c = 0;
    }
    sqlite3BtreeGetFilename((Btree *)0x170bff);
    iVar1 = sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if ((iVar1 == 0) || (local_38 < 2)) {
      local_34 = 0;
      while( true ) {
        bVar5 = false;
        if (local_3c == 0) {
          bVar5 = local_34 < in_RDI->nDb;
        }
        if (!bVar5) break;
        if (in_RDI->aDb[local_34].pBt != (Btree *)0x0) {
          local_3c = sqlite3BtreeCommitPhaseOne
                               (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40);
        }
        local_34 = local_34 + 1;
      }
      local_34 = 0;
      while( true ) {
        bVar5 = false;
        if (local_3c == 0) {
          bVar5 = local_34 < in_RDI->nDb;
        }
        if (!bVar5) break;
        if (in_RDI->aDb[local_34].pBt != (Btree *)0x0) {
          local_3c = sqlite3BtreeCommitPhaseTwo
                               (in_stack_ffffffffffffff48,
                                (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        }
        local_34 = local_34 + 1;
      }
      if (local_3c == 0) {
        sqlite3VtabCommit((sqlite3 *)0x170d60);
      }
    }
    else {
      pcVar3 = sqlite3BtreeGetFilename((Btree *)0x170d93);
      db_00 = (sqlite3 *)0x0;
      iVar7 = -0x55555556;
      local_84 = 0;
      iVar1 = sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
      ;
      pcVar3 = sqlite3MPrintf(in_RDI,"%.4c%s%.16c",0,pcVar3);
      if (pcVar3 == (char *)0x0) {
        local_3c = 7;
      }
      else {
        pcVar3 = pcVar3 + 4;
        do {
          if (local_84 != 0) {
            if (100 < local_84) {
              sqlite3_log(0xd,"MJ delete: %s",pcVar3);
              sqlite3OsDelete((sqlite3_vfs *)in_stack_ffffffffffffff40,
                              (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                              0);
              break;
            }
            if (local_84 == 1) {
              sqlite3_log(0xd,"MJ collide: %s",pcVar3);
            }
          }
          local_84 = local_84 + 1;
          sqlite3_randomness(CONCAT13(uVar6,CONCAT12(in_stack_ffffffffffffff56,
                                                     CONCAT11(in_stack_ffffffffffffff55,
                                                              in_stack_ffffffffffffff54))),
                             in_stack_ffffffffffffff48);
          sqlite3_snprintf(0xd,pcVar3 + iVar1,"-mj%06X9%02X",0xaaaaaa,0xaa);
          local_3c = sqlite3OsAccess((sqlite3_vfs *)
                                     CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff56,
                                                             CONCAT15(in_stack_ffffffffffffff55,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  in_stack_ffffffffffffff50)))),
                                     (char *)in_stack_ffffffffffffff48,
                                     (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                                     (int *)CONCAT44(in_stack_ffffffffffffff3c,
                                                     in_stack_ffffffffffffff38));
          in_stack_ffffffffffffff54 = local_3c == 0 && iVar7 != 0;
        } while ((bool)in_stack_ffffffffffffff54);
        if (local_3c == 0) {
          local_3c = sqlite3OsOpenMalloc((sqlite3_vfs *)in_stack_ffffffffffffff60,
                                         (char *)in_stack_ffffffffffffff58,
                                         (sqlite3_file **)
                                         CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff56,
                                                                 CONCAT15(in_stack_ffffffffffffff55,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  in_stack_ffffffffffffff50)))),
                                         (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                         (int *)in_stack_ffffffffffffff40);
        }
        if (local_3c == 0) {
          for (local_34 = 0; local_34 < in_RDI->nDb; local_34 = local_34 + 1) {
            iVar1 = sqlite3BtreeTxnState(in_RDI->aDb[local_34].pBt);
            psVar8 = db_00;
            if ((iVar1 == 2) &&
               (pBVar4 = (Btree *)sqlite3BtreeGetJournalname((Btree *)0x170ffc), psVar8 = db_00,
               pBVar4 != (Btree *)0x0)) {
              sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
              ;
              local_3c = sqlite3OsWrite((sqlite3_file *)
                                        CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff56,
                                                                CONCAT15(in_stack_ffffffffffffff55,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  in_stack_ffffffffffffff50)))),pBVar4,
                                        (int)((ulong)db_00 >> 0x20),
                                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ));
              sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
              ;
              in_stack_ffffffffffffff40 = db_00;
              in_stack_ffffffffffffff48 = pBVar4;
              if (local_3c != 0) {
                sqlite3OsCloseFree((sqlite3_file *)0x17107f);
                sqlite3OsDelete((sqlite3_vfs *)db_00,
                                (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ),0);
                sqlite3DbFree(db_00,(void *)CONCAT44(in_stack_ffffffffffffff3c,
                                                     in_stack_ffffffffffffff38));
                goto LAB_00171319;
              }
            }
            db_00 = psVar8;
          }
          uVar2 = sqlite3OsDeviceCharacteristics
                            ((sqlite3_file *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          if (((uVar2 & 0x400) == 0) &&
             (local_3c = sqlite3OsSync((sqlite3_file *)in_stack_ffffffffffffff40,
                                       in_stack_ffffffffffffff3c), local_3c != 0)) {
            sqlite3OsCloseFree((sqlite3_file *)0x17111c);
            sqlite3OsDelete((sqlite3_vfs *)in_stack_ffffffffffffff40,
                            (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0)
            ;
            sqlite3DbFree(in_stack_ffffffffffffff40,
                          (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          }
          else {
            local_34 = 0;
            while( true ) {
              uVar2 = in_stack_ffffffffffffff3c & 0xffffff;
              if (local_3c == 0) {
                uVar2 = CONCAT13(local_34 < in_RDI->nDb,(int3)in_stack_ffffffffffffff3c);
              }
              in_stack_ffffffffffffff3c = uVar2;
              if ((char)(in_stack_ffffffffffffff3c >> 0x18) == '\0') break;
              if (in_RDI->aDb[local_34].pBt != (Btree *)0x0) {
                local_3c = sqlite3BtreeCommitPhaseOne
                                     (in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40);
              }
              local_34 = local_34 + 1;
            }
            sqlite3OsCloseFree((sqlite3_file *)0x1711fb);
            if (local_3c == 0) {
              local_3c = sqlite3OsDelete((sqlite3_vfs *)in_stack_ffffffffffffff40,
                                         (char *)CONCAT44(in_stack_ffffffffffffff3c,
                                                          in_stack_ffffffffffffff38),0);
              sqlite3DbFree(in_stack_ffffffffffffff40,
                            (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
              if (local_3c == 0) {
                sqlite3BeginBenignMalloc();
                for (local_34 = 0; local_34 < in_RDI->nDb; local_34 = local_34 + 1) {
                  if (in_RDI->aDb[local_34].pBt != (Btree *)0x0) {
                    sqlite3BtreeCommitPhaseTwo
                              (in_stack_ffffffffffffff48,
                               (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
                  }
                }
                sqlite3EndBenignMalloc();
                sqlite3VtabCommit((sqlite3 *)0x17130b);
              }
            }
            else {
              sqlite3DbFree(in_stack_ffffffffffffff40,
                            (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
            }
          }
        }
        else {
          sqlite3DbFree(in_stack_ffffffffffffff40,
                        (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        }
      }
    }
  }
LAB_00171319:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar9) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbeCommit(sqlite3 *db, Vdbe *p){
  int i;
  int nTrans = 0;  /* Number of databases with an active write-transaction
                   ** that are candidates for a two-phase commit using a
                   ** super-journal */
  int rc = SQLITE_OK;
  int needXcommit = 0;

#ifdef SQLITE_OMIT_VIRTUALTABLE
  /* With this option, sqlite3VtabSync() is defined to be simply
  ** SQLITE_OK so p is not used.
  */
  UNUSED_PARAMETER(p);
#endif

  /* Before doing anything else, call the xSync() callback for any
  ** virtual module tables written in this transaction. This has to
  ** be done before determining whether a super-journal file is
  ** required, as an xSync() callback may add an attached database
  ** to the transaction.
  */
  rc = sqlite3VtabSync(db, p);

  /* This loop determines (a) if the commit hook should be invoked and
  ** (b) how many database files have open write transactions, not
  ** including the temp database. (b) is important because if more than
  ** one database file has an open write transaction, a super-journal
  ** file is required for an atomic commit.
  */
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( sqlite3BtreeTxnState(pBt)==SQLITE_TXN_WRITE ){
      /* Whether or not a database might need a super-journal depends upon
      ** its journal mode (among other things).  This matrix determines which
      ** journal modes use a super-journal and which do not */
      static const u8 aMJNeeded[] = {
        /* DELETE   */  1,
        /* PERSIST   */ 1,
        /* OFF       */ 0,
        /* TRUNCATE  */ 1,
        /* MEMORY    */ 0,
        /* WAL       */ 0
      };
      Pager *pPager;   /* Pager associated with pBt */
      needXcommit = 1;
      sqlite3BtreeEnter(pBt);
      pPager = sqlite3BtreePager(pBt);
      if( db->aDb[i].safety_level!=PAGER_SYNCHRONOUS_OFF
       && aMJNeeded[sqlite3PagerGetJournalMode(pPager)]
       && sqlite3PagerIsMemdb(pPager)==0
      ){
        assert( i!=1 );
        nTrans++;
      }
      rc = sqlite3PagerExclusiveLock(pPager);
      sqlite3BtreeLeave(pBt);
    }
  }
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* If there are any write-transactions at all, invoke the commit hook */
  if( needXcommit && db->xCommitCallback ){
    rc = db->xCommitCallback(db->pCommitArg);
    if( rc ){
      return SQLITE_CONSTRAINT_COMMITHOOK;
    }
  }

  /* The simple case - no more than one database file (not counting the
  ** TEMP database) has a transaction active.   There is no need for the
  ** super-journal.
  **
  ** If the return value of sqlite3BtreeGetFilename() is a zero length
  ** string, it means the main database is :memory: or a temp file.  In
  ** that case we do not support atomic multi-file commits, so use the
  ** simple case then too.
  */
  if( 0==sqlite3Strlen30(sqlite3BtreeGetFilename(db->aDb[0].pBt))
   || nTrans<=1
  ){
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, 0);
      }
    }

    /* Do the commit only if all databases successfully complete phase 1.
    ** If one of the BtreeCommitPhaseOne() calls fails, this indicates an
    ** IO error while deleting or truncating a journal file. It is unlikely,
    ** but could happen. In this case abandon processing and return the error.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseTwo(pBt, 0);
      }
    }
    if( rc==SQLITE_OK ){
      sqlite3VtabCommit(db);
    }
  }

  /* The complex case - There is a multi-file write-transaction active.
  ** This requires a super-journal file to ensure the transaction is
  ** committed atomically.
  */
#ifndef SQLITE_OMIT_DISKIO
  else{
    sqlite3_vfs *pVfs = db->pVfs;
    char *zSuper = 0;   /* File-name for the super-journal */
    char const *zMainFile = sqlite3BtreeGetFilename(db->aDb[0].pBt);
    sqlite3_file *pSuperJrnl = 0;
    i64 offset = 0;
    int res;
    int retryCount = 0;
    int nMainFile;

    /* Select a super-journal file name */
    nMainFile = sqlite3Strlen30(zMainFile);
    zSuper = sqlite3MPrintf(db, "%.4c%s%.16c", 0,zMainFile,0);
    if( zSuper==0 ) return SQLITE_NOMEM_BKPT;
    zSuper += 4;
    do {
      u32 iRandom;
      if( retryCount ){
        if( retryCount>100 ){
          sqlite3_log(SQLITE_FULL, "MJ delete: %s", zSuper);
          sqlite3OsDelete(pVfs, zSuper, 0);
          break;
        }else if( retryCount==1 ){
          sqlite3_log(SQLITE_FULL, "MJ collide: %s", zSuper);
        }
      }
      retryCount++;
      sqlite3_randomness(sizeof(iRandom), &iRandom);
      sqlite3_snprintf(13, &zSuper[nMainFile], "-mj%06X9%02X",
                               (iRandom>>8)&0xffffff, iRandom&0xff);
      /* The antipenultimate character of the super-journal name must
      ** be "9" to avoid name collisions when using 8+3 filenames. */
      assert( zSuper[sqlite3Strlen30(zSuper)-3]=='9' );
      sqlite3FileSuffix3(zMainFile, zSuper);
      rc = sqlite3OsAccess(pVfs, zSuper, SQLITE_ACCESS_EXISTS, &res);
    }while( rc==SQLITE_OK && res );
    if( rc==SQLITE_OK ){
      /* Open the super-journal. */
      rc = sqlite3OsOpenMalloc(pVfs, zSuper, &pSuperJrnl,
          SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE|
          SQLITE_OPEN_EXCLUSIVE|SQLITE_OPEN_SUPER_JOURNAL, 0
      );
    }
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zSuper-4);
      return rc;
    }

    /* Write the name of each database file in the transaction into the new
    ** super-journal file. If an error occurs at this point close
    ** and delete the super-journal file. All the individual journal files
    ** still have 'null' as the super-journal pointer, so they will roll
    ** back independently if a failure occurs.
    */
    for(i=0; i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( sqlite3BtreeTxnState(pBt)==SQLITE_TXN_WRITE ){
        char const *zFile = sqlite3BtreeGetJournalname(pBt);
        if( zFile==0 ){
          continue;  /* Ignore TEMP and :memory: databases */
        }
        assert( zFile[0]!=0 );
        rc = sqlite3OsWrite(pSuperJrnl, zFile, sqlite3Strlen30(zFile)+1,offset);
        offset += sqlite3Strlen30(zFile)+1;
        if( rc!=SQLITE_OK ){
          sqlite3OsCloseFree(pSuperJrnl);
          sqlite3OsDelete(pVfs, zSuper, 0);
          sqlite3DbFree(db, zSuper-4);
          return rc;
        }
      }
    }

    /* Sync the super-journal file. If the IOCAP_SEQUENTIAL device
    ** flag is set this is not required.
    */
    if( 0==(sqlite3OsDeviceCharacteristics(pSuperJrnl)&SQLITE_IOCAP_SEQUENTIAL)
     && SQLITE_OK!=(rc = sqlite3OsSync(pSuperJrnl, SQLITE_SYNC_NORMAL))
    ){
      sqlite3OsCloseFree(pSuperJrnl);
      sqlite3OsDelete(pVfs, zSuper, 0);
      sqlite3DbFree(db, zSuper-4);
      return rc;
    }

    /* Sync all the db files involved in the transaction. The same call
    ** sets the super-journal pointer in each individual journal. If
    ** an error occurs here, do not delete the super-journal file.
    **
    ** If the error occurs during the first call to
    ** sqlite3BtreeCommitPhaseOne(), then there is a chance that the
    ** super-journal file will be orphaned. But we cannot delete it,
    ** in case the super-journal file name was written into the journal
    ** file before the failure occurred.
    */
    for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        rc = sqlite3BtreeCommitPhaseOne(pBt, zSuper);
      }
    }
    sqlite3OsCloseFree(pSuperJrnl);
    assert( rc!=SQLITE_BUSY );
    if( rc!=SQLITE_OK ){
      sqlite3DbFree(db, zSuper-4);
      return rc;
    }

    /* Delete the super-journal file. This commits the transaction. After
    ** doing this the directory is synced again before any individual
    ** transaction files are deleted.
    */
    rc = sqlite3OsDelete(pVfs, zSuper, 1);
    sqlite3DbFree(db, zSuper-4);
    zSuper = 0;
    if( rc ){
      return rc;
    }

    /* All files and directories have already been synced, so the following
    ** calls to sqlite3BtreeCommitPhaseTwo() are only closing files and
    ** deleting or truncating journals. If something goes wrong while
    ** this is happening we don't really care. The integrity of the
    ** transaction is already guaranteed, but some stray 'cold' journals
    ** may be lying around. Returning an error code won't help matters.
    */
    disable_simulated_io_errors();
    sqlite3BeginBenignMalloc();
    for(i=0; i<db->nDb; i++){
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        sqlite3BtreeCommitPhaseTwo(pBt, 1);
      }
    }
    sqlite3EndBenignMalloc();
    enable_simulated_io_errors();

    sqlite3VtabCommit(db);
  }
#endif

  return rc;
}